

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.cpp
# Opt level: O3

void updateBits(uint8_t *buffer,int bitOffset,int bitLen,int value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *buffer_00;
  BitStreamWriter bitWriter;
  BitStreamWriter local_50;
  
  iVar3 = bitOffset + 7;
  if (-1 < bitOffset) {
    iVar3 = bitOffset;
  }
  buffer_00 = buffer + (iVar3 >> 3);
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  uVar4 = bitOffset % 8;
  iVar3 = bitLen + 7;
  if (-1 < bitLen) {
    iVar3 = bitLen;
  }
  local_50.m_curVal = 0;
  local_50.m_bitWrited = 0;
  BitStream::setBuffer(&local_50.super_BitStream,buffer_00,buffer_00 + (long)(iVar3 >> 3) + 5);
  local_50.m_curVal = 0;
  local_50.m_bitWrited = 0;
  uVar2 = bitLen + bitOffset;
  uVar1 = bitLen + 7 + bitOffset;
  if (-1 < (int)uVar2) {
    uVar1 = uVar2;
  }
  iVar3 = uVar2 - (uVar1 & 0xfffffff8);
  if (0 < (int)uVar4) {
    BitStreamWriter::putBits(&local_50,uVar4,(uint)(*buffer_00 >> (8U - (char)uVar4 & 0x1f)));
  }
  BitStreamWriter::putBits(&local_50,bitLen,value);
  if (0 < iVar3) {
    uVar4 = 8 - iVar3;
    BitStreamWriter::putBits
              (&local_50,uVar4,~(-1 << ((byte)uVar4 & 0x1f)) & (uint)buffer[(int)uVar1 >> 3]);
  }
  BitStreamWriter::flushBits(&local_50);
  return;
}

Assistant:

void updateBits(uint8_t* buffer, const int bitOffset, const int bitLen, const int value)
{
    uint8_t* ptr = buffer + bitOffset / 8;
    BitStreamWriter bitWriter{};
    const int byteOffset = bitOffset % 8;
    bitWriter.setBuffer(ptr, ptr + (bitLen / 8 + 5));

    const uint8_t* ptr_end = buffer + (bitOffset + bitLen) / 8;
    const int endBitsPostfix = 8 - ((bitOffset + bitLen) % 8);

    if (byteOffset > 0)
    {
        const int prefix = *ptr >> (8 - byteOffset);
        bitWriter.putBits(byteOffset, prefix);
    }
    bitWriter.putBits(bitLen, value);

    if (endBitsPostfix < 8)
    {
        const int postfix = *ptr_end & (1 << endBitsPostfix) - 1;
        bitWriter.putBits(endBitsPostfix, postfix);
    }
    bitWriter.flushBits();
}